

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O2

void erase_in_line(options *param_1)

{
  int iVar1;
  int row;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = 2;
  for (uVar2 = 1; uVar2 != 0x19; uVar2 = uVar2 + 1) {
    if (erase_in_line(options_const&)::pi == '\0') {
      iVar1 = __cxa_guard_acquire(&erase_in_line(options_const&)::pi);
      if (iVar1 != 0) {
        erase_in_line::pi = 3.1415927;
        __cxa_guard_release(&erase_in_line(options_const&)::pi);
      }
    }
    dVar4 = sin(((double)erase_in_line::pi * (double)iVar3) / 24.0);
    printf("\x1b[%d;%dH\x1b[1K\x1b[24C\x1b[K",(ulong)uVar2,(ulong)(uint)(int)(dVar4 * 28.0 + 28.0));
    iVar3 = iVar3 + 2;
  }
  return;
}

Assistant:

void erase_in_line(const options &)
{
    for (int row = 1; row <= 24; ++row)
    {
        static const float pi = acos(-1.0f);
        int col = static_cast<int>((40-12) + (40-12)*std::sin(row*2.0*pi/24));
        std::printf("\033[%d;%dH\033[1K\033[24C\033[K", row, col);
    }
}